

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O0

void dtrmv(char uplo,char trans,char diag,int n,double *a,int lda,double *x,int incx)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_61;
  string local_60;
  double local_40;
  double temp;
  int iStack_30;
  bool nounit;
  int kx;
  int jx;
  int j;
  int ix;
  int info;
  int i;
  int lda_local;
  double *a_local;
  int n_local;
  char diag_local;
  char trans_local;
  char uplo_local;
  
  temp._4_4_ = 0;
  j = 0;
  info = lda;
  _i = a;
  a_local._0_4_ = n;
  a_local._5_1_ = diag;
  a_local._6_1_ = trans;
  a_local._7_1_ = uplo;
  bVar2 = lsame(uplo,'U');
  if ((bVar2) || (bVar2 = lsame(a_local._7_1_,'L'), bVar2)) {
    bVar2 = lsame(a_local._6_1_,'N');
    if (((bVar2) || (bVar2 = lsame(a_local._6_1_,'T'), bVar2)) ||
       (bVar2 = lsame(a_local._6_1_,'C'), bVar2)) {
      bVar2 = lsame(a_local._5_1_,'U');
      if ((bVar2) || (bVar2 = lsame(a_local._5_1_,'N'), bVar2)) {
        iVar4 = info;
        if ((int)a_local < 0) {
          j = 4;
        }
        else {
          iVar3 = i4_max(1,(int)a_local);
          if (iVar4 < iVar3) {
            j = 6;
          }
          else if (incx == 0) {
            j = 8;
          }
        }
      }
      else {
        j = 3;
      }
    }
    else {
      j = 2;
    }
  }
  else {
    j = 1;
  }
  if (j == 0) {
    if ((int)a_local != 0) {
      temp._3_1_ = lsame(a_local._5_1_,'N');
      if (incx < 1) {
        temp._4_4_ = -(((int)a_local + -1) * incx);
      }
      else if (incx != 1) {
        temp._4_4_ = 0;
      }
      bVar2 = lsame(a_local._6_1_,'N');
      if (bVar2) {
        bVar2 = lsame(a_local._7_1_,'U');
        if (bVar2) {
          if (incx == 1) {
            for (kx = 0; kx < (int)a_local; kx = kx + 1) {
              if ((x[kx] != 0.0) || (NAN(x[kx]))) {
                dVar1 = x[kx];
                for (ix = 0; ix < kx; ix = ix + 1) {
                  x[ix] = dVar1 * _i[ix + kx * info] + x[ix];
                }
                if ((temp._3_1_ & 1) != 0) {
                  x[kx] = x[kx] * _i[kx + kx * info];
                }
              }
            }
          }
          else {
            iStack_30 = temp._4_4_;
            for (kx = 0; kx < (int)a_local; kx = kx + 1) {
              if ((x[iStack_30] != 0.0) || (NAN(x[iStack_30]))) {
                dVar1 = x[iStack_30];
                jx = temp._4_4_;
                for (ix = 0; ix < kx; ix = ix + 1) {
                  x[jx] = dVar1 * _i[ix + kx * info] + x[jx];
                  jx = jx + incx;
                }
                if ((temp._3_1_ & 1) != 0) {
                  x[iStack_30] = x[iStack_30] * _i[kx + kx * info];
                }
              }
              iStack_30 = iStack_30 + incx;
            }
          }
        }
        else {
          kx = (int)a_local;
          if (incx == 1) {
            while (kx = kx + -1, -1 < kx) {
              if ((x[kx] != 0.0) || (NAN(x[kx]))) {
                dVar1 = x[kx];
                ix = (int)a_local;
                while (ix = ix + -1, kx < ix) {
                  x[ix] = dVar1 * _i[ix + kx * info] + x[ix];
                }
                if ((temp._3_1_ & 1) != 0) {
                  x[kx] = x[kx] * _i[kx + kx * info];
                }
              }
            }
          }
          else {
            iVar4 = temp._4_4_ + ((int)a_local + -1) * incx;
            iStack_30 = iVar4;
            while (kx = kx + -1, -1 < kx) {
              if ((x[iStack_30] != 0.0) || (NAN(x[iStack_30]))) {
                dVar1 = x[iStack_30];
                jx = iVar4;
                ix = (int)a_local;
                while (ix = ix + -1, kx < ix) {
                  x[jx] = dVar1 * _i[ix + kx * info] + x[jx];
                  jx = jx - incx;
                }
                if ((temp._3_1_ & 1) != 0) {
                  x[iStack_30] = x[iStack_30] * _i[kx + kx * info];
                }
              }
              iStack_30 = iStack_30 - incx;
            }
          }
        }
      }
      else {
        bVar2 = lsame(a_local._7_1_,'U');
        if (bVar2) {
          if (incx == 1) {
            while (kx = (int)a_local + -1, -1 < kx) {
              local_40 = x[kx];
              if ((temp._3_1_ & 1) != 0) {
                local_40 = local_40 * _i[kx + kx * info];
              }
              for (ix = (int)a_local + -2; -1 < ix; ix = ix + -1) {
                local_40 = _i[ix + kx * info] * x[ix] + local_40;
              }
              x[kx] = local_40;
              a_local._0_4_ = kx;
            }
          }
          else {
            iStack_30 = temp._4_4_ + ((int)a_local + -1) * incx;
            while (kx = (int)a_local + -1, -1 < kx) {
              local_40 = x[iStack_30];
              jx = iStack_30;
              if ((temp._3_1_ & 1) != 0) {
                local_40 = local_40 * _i[kx + kx * info];
              }
              for (ix = (int)a_local + -2; -1 < ix; ix = ix + -1) {
                jx = jx - incx;
                local_40 = _i[ix + kx * info] * x[jx] + local_40;
              }
              x[iStack_30] = local_40;
              iStack_30 = iStack_30 - incx;
              a_local._0_4_ = kx;
            }
          }
        }
        else if (incx == 1) {
          for (kx = 0; kx < (int)a_local; kx = kx + 1) {
            local_40 = x[kx];
            ix = kx;
            if ((temp._3_1_ & 1) != 0) {
              local_40 = local_40 * _i[kx + kx * info];
            }
            while (ix = ix + 1, ix < (int)a_local) {
              local_40 = _i[ix + kx * info] * x[ix] + local_40;
            }
            x[kx] = local_40;
          }
        }
        else {
          iStack_30 = temp._4_4_;
          for (kx = 0; kx < (int)a_local; kx = kx + 1) {
            local_40 = x[iStack_30];
            jx = iStack_30;
            ix = kx;
            if ((temp._3_1_ & 1) != 0) {
              local_40 = local_40 * _i[kx + kx * info];
            }
            while (ix = ix + 1, ix < (int)a_local) {
              jx = jx + incx;
              local_40 = _i[ix + kx * info] * x[jx] + local_40;
            }
            x[iStack_30] = local_40;
            iStack_30 = iStack_30 + incx;
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"DTRMV",&local_61);
    xerbla(&local_60,j);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return;
}

Assistant:

void dtrmv ( char uplo, char trans, char diag, int n, double a[], int lda, 
  double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMV computes x: = A*x or x = A'*x for a triangular matrix A.
//
//  Discussion:
//
//    DTRMV performs one of the matrix-vector operations
//
//      x := A*x,   or   x := A'*x,
//
//    where x is an n element vector and  A is an n by n unit, or non-unit,
//    upper or lower triangular matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char UPLO, specifies whether the matrix is an upper or
//    lower triangular matrix as follows:
//    'u' or 'U': A is an upper triangular matrix.
//    'l' or 'L': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the operation to be performed as
//    follows:
//    'n' or 'N': x := A*x.
//    't' or 'T': x := A'*x.
//    'c' or 'C': x := A'*x.
//
//    Input, char DIAG, specifies whether or not A is unit
//    triangular as follows:
//    'u' or 'U': A is assumed to be unit triangular.
//    'n' or 'N': A is not assumed to be unit triangular.
//
//    Input, int N, the order of the matrix A.
//    0 <= N.
//
//    Input, double A[LDA*N].
//    Before entry with  UPLO = 'u' or 'U', the leading n by n
//    upper triangular part of the array A must contain the upper
//    triangular matrix and the strictly lower triangular part of
//    A is not referenced.
//    Before entry with UPLO = 'l' or 'L', the leading n by n
//    lower triangular part of the array A must contain the lower
//    triangular matrix and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'u' or 'U', the diagonal elements of
//    A are not referenced either, but are assumed to be unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, N ) <= LDA.
//
//    Input/output, double X[1+(N-1)*abs( INCX)].
//    Before entry, the incremented array X must contain the n
//    element vector x. On exit, X is overwritten with the
//    tranformed vector x.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jx;
  int kx = 0;
  bool nounit;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if  ( ! lsame ( uplo, 'U' ) && ! lsame ( uplo, 'L' )  )
  {
    info = 1;
  }
  else if ( ! lsame ( trans, 'N' ) && ! lsame ( trans, 'T' ) && 
            ! lsame ( trans, 'C' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 3;
  }
  else if ( n < 0 )
  {
    info = 4;
  }
  else if ( lda < i4_max ( 1, n ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }

  if ( info != 0 )
  {
    xerbla ( "DTRMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 ) 
  {
    return;
  }

  nounit = lsame ( diag, 'N' );
//
//  Set up the start point in X if the increment is not unity. This
//  will be  ( N - 1 ) * INCX  too small for descending loops.
//
  if ( incx <= 0 )
  {
    kx = 0 - ( n - 1 ) * incx;
  }
  else if ( incx != 1 )
  {
    kx = 0;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( lsame ( trans, 'N' ) )
  {
//
//  Form x := A*x.
//
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = 0; i < j; i++ )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = 0; i < j; i++ )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix + incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx + incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = n - 1; j < i; i-- )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        kx = kx + ( n - 1 ) * incx;
        jx = kx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = n - 1; j < i; i-- )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix - incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx - incx;
        }
      }
    }
  }
//
//  Form x := A'*x.
//
  else
  {
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx + ( n - 1 ) * incx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            ix = ix - incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx - incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            ix = ix + incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx + incx;
        }
      }
    }
  }

  return;
}